

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

bool __thiscall
cmGlobalGenerator::IsExcluded
          (cmGlobalGenerator *this,cmLocalGenerator *root,cmGeneratorTarget *target)

{
  undefined8 this_00;
  bool bVar1;
  ostream *poVar2;
  string *psVar3;
  cmGlobalGenerator *pcVar4;
  cmLocalGenerator *gen;
  string_view val;
  string local_348;
  string local_328 [32];
  undefined1 local_308 [8];
  ostringstream e;
  string local_190;
  string_view local_170;
  string local_160;
  string local_140;
  undefined1 local_120 [8];
  cmGeneratorExpressionInterpreter genexInterpreter;
  string *config;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *configs;
  uint falseCount;
  uint trueCount;
  cmValue exclude;
  allocator<char> local_51;
  undefined1 local_50 [8];
  string EXCLUDE_FROM_ALL;
  cmMakefile *mf;
  cmGeneratorTarget *target_local;
  cmLocalGenerator *root_local;
  cmGlobalGenerator *this_local;
  
  bVar1 = cmGeneratorTarget::IsInBuildSystem(target);
  if (bVar1) {
    EXCLUDE_FROM_ALL.field_2._8_8_ = cmLocalGenerator::GetMakefile(root);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_50,"EXCLUDE_FROM_ALL",&local_51);
    std::allocator<char>::~allocator(&local_51);
    _falseCount = cmGeneratorTarget::GetProperty(target,(string *)local_50);
    bVar1 = cmValue::operator_cast_to_bool((cmValue *)&falseCount);
    if (bVar1) {
      configs._4_4_ = 0;
      configs._0_4_ = 0;
      cmMakefile::GetGeneratorConfigs_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range2,(cmMakefile *)EXCLUDE_FROM_ALL.field_2._8_8_,IncludeEmptyConfig);
      local_80 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range2;
      __end2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&__range2);
      config = (string *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__range2);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)&config);
        if (!bVar1) break;
        genexInterpreter.Language.field_2._8_8_ =
             __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end2);
        std::__cxx11::string::string
                  ((string *)&local_140,(string *)genexInterpreter.Language.field_2._8_8_);
        std::__cxx11::string::string((string *)&local_160);
        cmGeneratorExpressionInterpreter::cmGeneratorExpressionInterpreter
                  ((cmGeneratorExpressionInterpreter *)local_120,root,&local_140,target,&local_160);
        std::__cxx11::string::~string((string *)&local_160);
        std::__cxx11::string::~string((string *)&local_140);
        psVar3 = cmValue::operator*[abi_cxx11_((cmValue *)&falseCount);
        std::__cxx11::string::string((string *)&local_190,(string *)psVar3);
        psVar3 = cmGeneratorExpressionInterpreter::Evaluate
                           ((cmGeneratorExpressionInterpreter *)local_120,&local_190,
                            (string *)local_50);
        val = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar3);
        local_170 = val;
        bVar1 = cmIsOn(val);
        std::__cxx11::string::~string((string *)&local_190);
        if (bVar1) {
          configs._4_4_ = configs._4_4_ + 1;
        }
        else {
          configs._0_4_ = (int)configs + 1;
        }
        cmGeneratorExpressionInterpreter::~cmGeneratorExpressionInterpreter
                  ((cmGeneratorExpressionInterpreter *)local_120);
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end2);
      }
      if ((configs._4_4_ != 0) && ((int)configs != 0)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_308);
        poVar2 = std::operator<<((ostream *)local_308,"The EXCLUDE_FROM_ALL property of target \"");
        psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(target);
        poVar2 = std::operator<<(poVar2,(string *)psVar3);
        poVar2 = std::operator<<(poVar2,
                                 "\" varies by configuration. This is not supported by the \"");
        pcVar4 = cmLocalGenerator::GetGlobalGenerator(root);
        (*pcVar4->_vptr_cmGlobalGenerator[3])(local_328);
        poVar2 = std::operator<<(poVar2,local_328);
        std::operator<<(poVar2,"\" generator.");
        std::__cxx11::string::~string(local_328);
        this_00 = EXCLUDE_FROM_ALL.field_2._8_8_;
        std::__cxx11::ostringstream::str();
        cmMakefile::IssueMessage((cmMakefile *)this_00,FATAL_ERROR,&local_348);
        std::__cxx11::string::~string((string *)&local_348);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_308);
      }
      this_local._7_1_ = configs._4_4_ != 0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range2);
    }
    else {
      gen = cmGeneratorTarget::GetLocalGenerator(target);
      this_local._7_1_ = IsExcluded(this,root,gen);
    }
    std::__cxx11::string::~string((string *)local_50);
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool cmGlobalGenerator::IsExcluded(cmLocalGenerator* root,
                                   const cmGeneratorTarget* target) const
{
  if (!target->IsInBuildSystem()) {
    return true;
  }
  cmMakefile* mf = root->GetMakefile();
  const std::string EXCLUDE_FROM_ALL = "EXCLUDE_FROM_ALL";
  if (cmValue exclude = target->GetProperty(EXCLUDE_FROM_ALL)) {
    // Expand the property value per configuration.
    unsigned int trueCount = 0;
    unsigned int falseCount = 0;
    const std::vector<std::string>& configs =
      mf->GetGeneratorConfigs(cmMakefile::IncludeEmptyConfig);
    for (const std::string& config : configs) {
      cmGeneratorExpressionInterpreter genexInterpreter(root, config, target);
      if (cmIsOn(genexInterpreter.Evaluate(*exclude, EXCLUDE_FROM_ALL))) {
        ++trueCount;
      } else {
        ++falseCount;
      }
    }

    // Check whether the genex expansion of the property agrees in all
    // configurations.
    if (trueCount > 0 && falseCount > 0) {
      std::ostringstream e;
      e << "The EXCLUDE_FROM_ALL property of target \"" << target->GetName()
        << "\" varies by configuration. This is not supported by the \""
        << root->GetGlobalGenerator()->GetName() << "\" generator.";
      mf->IssueMessage(MessageType::FATAL_ERROR, e.str());
    }
    return trueCount;
  }
  // This target is included in its directory.  Check whether the
  // directory is excluded.
  return this->IsExcluded(root, target->GetLocalGenerator());
}